

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O0

void Ssc_ManPrintStats(Ssc_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  double local_a8;
  double local_98;
  double local_88;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  double local_38;
  double local_28;
  Ssc_Man_t *p_local;
  
  Abc_Print(1,
            "Parameters: SimWords = %d. SatConfs = %d. SatVarMax = %d. CallsRec = %d. Verbose = %d.\n"
            ,(ulong)(uint)p->pPars->nWords,(ulong)(uint)p->pPars->nBTLimit,
            (ulong)(uint)p->pPars->nSatVarMax,(ulong)(uint)p->pPars->nCallsRecycle,
            p->pPars->fVerbose);
  Abc_Print(1,"SAT calls : Total = %d. Proof = %d. Cex = %d. Undec = %d.\n",
            (ulong)(uint)p->nSatCalls,(ulong)(uint)p->nSatCallsUnsat,(ulong)(uint)p->nSatCallsSat,
            (ulong)(uint)p->nSatCallsUndec);
  uVar1 = sat_solver_nvars(p->pSat);
  uVar2 = sat_solver_nclauses(p->pSat);
  Abc_Print(1,"SAT solver: Vars = %d. Clauses = %d. Recycles = %d. Sim rounds = %d.\n",(ulong)uVar1,
            (ulong)uVar2,(ulong)(uint)p->nRecycles,(ulong)(uint)p->nSimRounds);
  p->timeOther = (((((p->timeTotal - p->timeSimInit) - p->timeSimSat) - p->timeCnfGen) -
                  p->timeSatSat) - p->timeSatUnsat) - p->timeSatUndec;
  Abc_Print(1,"%s =","Initialization ");
  if (p->timeTotal == 0) {
    local_28 = 0.0;
  }
  else {
    local_28 = ((double)p->timeSimInit * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSimInit * 1.0) / 1000000.0,local_28);
  Abc_Print(1,"%s =","SAT simulation ");
  if (p->timeTotal == 0) {
    local_38 = 0.0;
  }
  else {
    local_38 = ((double)p->timeSimSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSimSat * 1.0) / 1000000.0,local_38);
  Abc_Print(1,"%s =","CNF generation ");
  if (p->timeTotal == 0) {
    local_48 = 0.0;
  }
  else {
    local_48 = ((double)p->timeSimSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSimSat * 1.0) / 1000000.0,local_48);
  Abc_Print(1,"%s =","SAT solving    ");
  if (p->timeTotal == 0) {
    local_58 = 0.0;
  }
  else {
    local_58 = ((double)(p->timeSat - p->timeCnfGen) * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(p->timeSat - p->timeCnfGen) * 1.0) / 1000000.0,
            local_58);
  Abc_Print(1,"%s =","  unsat        ");
  if (p->timeTotal == 0) {
    local_68 = 0.0;
  }
  else {
    local_68 = ((double)p->timeSatUnsat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatUnsat * 1.0) / 1000000.0,local_68);
  Abc_Print(1,"%s =","  sat          ");
  if (p->timeTotal == 0) {
    local_78 = 0.0;
  }
  else {
    local_78 = ((double)p->timeSatSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatSat * 1.0) / 1000000.0,local_78);
  Abc_Print(1,"%s =","  undecided    ");
  if (p->timeTotal == 0) {
    local_88 = 0.0;
  }
  else {
    local_88 = ((double)p->timeSatUndec * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatUndec * 1.0) / 1000000.0,local_88);
  Abc_Print(1,"%s =","Other          ");
  if (p->timeTotal == 0) {
    local_98 = 0.0;
  }
  else {
    local_98 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOther * 1.0) / 1000000.0,local_98);
  Abc_Print(1,"%s =","TOTAL          ");
  if (p->timeTotal == 0) {
    local_a8 = 0.0;
  }
  else {
    local_a8 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_a8);
  return;
}

Assistant:

void Ssc_ManPrintStats( Ssc_Man_t * p )
{
    Abc_Print( 1, "Parameters: SimWords = %d. SatConfs = %d. SatVarMax = %d. CallsRec = %d. Verbose = %d.\n",
        p->pPars->nWords, p->pPars->nBTLimit, p->pPars->nSatVarMax, p->pPars->nCallsRecycle, p->pPars->fVerbose );
    Abc_Print( 1, "SAT calls : Total = %d. Proof = %d. Cex = %d. Undec = %d.\n",
        p->nSatCalls, p->nSatCallsUnsat, p->nSatCallsSat, p->nSatCallsUndec );
    Abc_Print( 1, "SAT solver: Vars = %d. Clauses = %d. Recycles = %d. Sim rounds = %d.\n",
        sat_solver_nvars(p->pSat), sat_solver_nclauses(p->pSat), p->nRecycles, p->nSimRounds );

    p->timeOther = p->timeTotal - p->timeSimInit - p->timeSimSat - p->timeCnfGen - p->timeSatSat - p->timeSatUnsat - p->timeSatUndec;
    ABC_PRTP( "Initialization ", p->timeSimInit,            p->timeTotal );
    ABC_PRTP( "SAT simulation ", p->timeSimSat,             p->timeTotal );
    ABC_PRTP( "CNF generation ", p->timeSimSat,             p->timeTotal );
    ABC_PRTP( "SAT solving    ", p->timeSat-p->timeCnfGen,  p->timeTotal );
    ABC_PRTP( "  unsat        ", p->timeSatUnsat,           p->timeTotal );
    ABC_PRTP( "  sat          ", p->timeSatSat,             p->timeTotal );
    ABC_PRTP( "  undecided    ", p->timeSatUndec,           p->timeTotal );
    ABC_PRTP( "Other          ", p->timeOther,              p->timeTotal );
    ABC_PRTP( "TOTAL          ", p->timeTotal,              p->timeTotal );
}